

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_setup_pake_shares(SSL_HANDSHAKE *hs)

{
  CERT *this;
  size_t sVar1;
  SSL_CREDENTIAL *v;
  Span<const_unsigned_char> id_prover;
  Span<const_unsigned_char> context;
  Span<const_unsigned_char> id_verifier;
  Span<const_unsigned_char> w0;
  Span<const_unsigned_char> w1;
  CBB *__p_00;
  bool bVar2;
  int iVar3;
  pointer __p;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *puVar4;
  Prover *pPVar5;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *puVar6;
  long lVar7;
  long lVar8;
  Span<unsigned_char> out_share;
  ScopedCBB cbb;
  CBB shares;
  uint8_t prover_share [65];
  CBB pake_message;
  CBB server_identity;
  CBB client_identity;
  
  Array<unsigned_char>::Reset(&hs->pake_share_bytes);
  bVar2 = true;
  if (hs->max_version < 0x304) {
    return true;
  }
  this = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
  puVar6 = (this->credentials).data_;
  sVar1 = (this->credentials).size_;
  puVar4 = puVar6 + sVar1;
  lVar7 = sVar1 * 8;
  for (lVar8 = (long)sVar1 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (*(int *)((long)puVar6->_M_t + 4) == 2) goto LAB_00133040;
    if (*(int *)((long)puVar6[1]._M_t + 4) == 2) {
      puVar6 = puVar6 + 1;
      goto LAB_00133040;
    }
    if (*(int *)((long)puVar6[2]._M_t + 4) == 2) {
      puVar6 = puVar6 + 2;
      goto LAB_00133040;
    }
    if (*(int *)((long)puVar6[3]._M_t + 4) == 2) {
      puVar6 = puVar6 + 3;
      goto LAB_00133040;
    }
    puVar6 = puVar6 + 4;
    lVar7 = lVar7 + -0x20;
  }
  lVar7 = lVar7 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      if (lVar7 != 3) {
        return true;
      }
      if (*(int *)((long)puVar6->_M_t + 4) == 2) goto LAB_00133040;
      puVar6 = puVar6 + 1;
    }
    if (*(int *)((long)puVar6->_M_t + 4) == 2) goto LAB_00133040;
    puVar6 = puVar6 + 1;
  }
  if (*(int *)((long)puVar6->_M_t + 4) != 2) {
    return true;
  }
LAB_00133040:
  if (puVar6 != puVar4) {
    if (sVar1 == 1) {
      puVar4 = Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::operator[]
                         (&this->credentials,0);
      v = (puVar4->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
      if (v->type != kSPAKE2PlusV1Client) {
        __assert_fail("cred->type == SSLCredentialType::kSPAKE2PlusV1Client",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc16,"bool bssl::ssl_setup_pake_shares(SSL_HANDSHAKE *)");
      }
      pPVar5 = New<bssl::spake2plus::Prover>();
      prover_share[0] = '\0';
      prover_share[1] = '\0';
      prover_share[2] = '\0';
      prover_share[3] = '\0';
      prover_share[4] = '\0';
      prover_share[5] = '\0';
      prover_share[6] = '\0';
      prover_share[7] = '\0';
      std::__uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter> *)
                 &hs->pake_prover,pPVar5);
      std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter> *)prover_share);
      pPVar5 = (hs->pake_prover)._M_t.
               super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl;
      if (((pPVar5 == (Prover *)0x0) ||
          (context.data_ = (v->pake_context).data_, context.size_ = (v->pake_context).size_,
          id_prover.data_ = (v->client_identity).data_, id_prover.size_ = (v->client_identity).size_
          , id_verifier.data_ = (v->server_identity).data_,
          id_verifier.size_ = (v->server_identity).size_, w0.data_ = (v->password_verifier_w0).data_
          , w0.size_ = (v->password_verifier_w0).size_, w1.data_ = (v->password_verifier_w1).data_,
          w1.size_ = (v->password_verifier_w1).size_,
          bVar2 = spake2plus::Prover::Init
                            (pPVar5,context,id_prover,id_verifier,w0,w1,
                             (Span<const_unsigned_char>)ZEXT816(0)), !bVar2)) ||
         (out_share.size_ = 0x41, out_share.data_ = prover_share,
         bVar2 = spake2plus::Prover::GenerateShare
                           ((hs->pake_prover)._M_t.
                            super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                            .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl,
                            out_share), !bVar2)) {
        bVar2 = false;
      }
      else {
        UpRef((bssl *)&cbb,v);
        __p_00 = cbb.ctx_.child;
        cbb.ctx_.child = (CBB *)0x0;
        std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)&hs->credential,
                   (pointer)__p_00);
        std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&cbb);
        CBB_zero(&cbb.ctx_);
        iVar3 = CBB_init(&cbb.ctx_,0x40);
        if (((((iVar3 == 0) ||
              (iVar3 = CBB_add_u16_length_prefixed(&cbb.ctx_,&client_identity), iVar3 == 0)) ||
             ((iVar3 = CBB_add_bytes(&client_identity,(v->client_identity).data_,
                                     (v->client_identity).size_), iVar3 == 0 ||
              ((iVar3 = CBB_add_u16_length_prefixed(&cbb.ctx_,&server_identity), iVar3 == 0 ||
               (iVar3 = CBB_add_bytes(&server_identity,(v->server_identity).data_,
                                      (v->server_identity).size_), iVar3 == 0)))))) ||
            (iVar3 = CBB_add_u16_length_prefixed(&cbb.ctx_,&shares), iVar3 == 0)) ||
           (((iVar3 = CBB_add_u16(&shares,0x7d96), iVar3 == 0 ||
             (iVar3 = CBB_add_u16_length_prefixed(&shares,&pake_message), iVar3 == 0)) ||
            (iVar3 = CBB_add_bytes(&pake_message,prover_share,0x41), iVar3 == 0)))) {
          bVar2 = false;
        }
        else {
          bVar2 = CBBFinishArray(&cbb.ctx_,&hs->pake_share_bytes);
        }
        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
      }
    }
    else {
      bVar2 = false;
      ERR_put_error(0x10,0,0x147,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xc12);
    }
  }
  return bVar2;
}

Assistant:

bool ssl_setup_pake_shares(SSL_HANDSHAKE *hs) {
  hs->pake_share_bytes.Reset();
  if (hs->max_version < TLS1_3_VERSION) {
    return true;
  }

  const auto &creds = hs->config->cert->credentials;
  if (std::none_of(creds.begin(), creds.end(), [](const auto &cred) {
        return cred->type == SSLCredentialType::kSPAKE2PlusV1Client;
      })) {
    // If there were no configured PAKE credentials, proceed without filling
    // in the PAKE extension.
    return true;
  }

  // We currently do not support multiple PAKE credentials, or a mix of PAKE and
  // non-PAKE credentials.
  if (creds.size() != 1u) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_CREDENTIAL_LIST);
    return false;
  }
  SSL_CREDENTIAL *cred = creds[0].get();
  assert(cred->type == SSLCredentialType::kSPAKE2PlusV1Client);

  hs->pake_prover = MakeUnique<spake2plus::Prover>();
  uint8_t prover_share[spake2plus::kShareSize];
  if (hs->pake_prover == nullptr ||
      !hs->pake_prover->Init(cred->pake_context, cred->client_identity,
                             cred->server_identity, cred->password_verifier_w0,
                             cred->password_verifier_w1) ||
      !hs->pake_prover->GenerateShare(prover_share)) {
    return false;
  }

  hs->credential = UpRef(cred);

  bssl::ScopedCBB cbb;
  CBB shares, client_identity, server_identity, pake_message;
  if (!CBB_init(cbb.get(), 64) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &client_identity) ||
      !CBB_add_bytes(&client_identity, cred->client_identity.data(),
                     cred->client_identity.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &server_identity) ||
      !CBB_add_bytes(&server_identity, cred->server_identity.data(),
                     cred->server_identity.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &shares) ||
      !CBB_add_u16(&shares, SSL_PAKE_SPAKE2PLUSV1) ||
      !CBB_add_u16_length_prefixed(&shares, &pake_message) ||
      !CBB_add_bytes(&pake_message, prover_share, sizeof(prover_share))) {
    return false;
  }

  return CBBFinishArray(cbb.get(), &hs->pake_share_bytes);
}